

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtCheckDsdAnd(word t,int i,int j,word *pOut)

{
  int iVar1;
  word wVar2;
  word wVar3;
  word wVar4;
  word wVar5;
  word wVar6;
  ulong uVar7;
  
  wVar2 = Abc_Tt6Cofactor0(t,i);
  wVar3 = Abc_Tt6Cofactor1(t,i);
  wVar4 = Abc_Tt6Cofactor0(wVar2,j);
  wVar5 = Abc_Tt6Cofactor1(wVar2,j);
  wVar6 = Abc_Tt6Cofactor0(wVar3,j);
  wVar3 = Abc_Tt6Cofactor1(wVar3,j);
  wVar2 = wVar4;
  if (wVar4 == wVar6 && wVar4 == wVar5) {
    iVar1 = 0;
    wVar5 = wVar3;
  }
  else {
    uVar7 = wVar4 ^ wVar3;
    if (uVar7 == 0 && (wVar3 ^ wVar6) == 0) {
      iVar1 = 1;
      wVar2 = wVar6;
    }
    else if (uVar7 == 0 && (wVar3 ^ wVar5) == 0) {
      iVar1 = 2;
      wVar2 = wVar5;
      wVar5 = wVar6;
    }
    else if ((wVar3 ^ wVar5) == 0 && (wVar3 ^ wVar6) == 0) {
      iVar1 = 3;
      wVar2 = wVar6;
      wVar5 = wVar4;
    }
    else {
      if (uVar7 != 0 || wVar5 != wVar6) {
        return -1;
      }
      iVar1 = 4;
    }
  }
  if (pOut != (word *)0x0) {
    *pOut = (wVar5 ^ wVar2) & s_Truths6[i] ^ wVar2;
  }
  return iVar1;
}

Assistant:

static inline int Abc_TtCheckDsdAnd( word t, int i, int j, word * pOut )
{
    word c0 = Abc_Tt6Cofactor0( t, i );
    word c1 = Abc_Tt6Cofactor1( t, i );
    word c00 = Abc_Tt6Cofactor0( c0, j );
    word c01 = Abc_Tt6Cofactor1( c0, j );
    word c10 = Abc_Tt6Cofactor0( c1, j );
    word c11 = Abc_Tt6Cofactor1( c1, j );
    if ( c00 == c01 && c00 == c10 ) //  i *  j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c00) | (s_Truths6[i] & c11);
        return 0;
    }
    if ( c11 == c00 && c11 == c10 ) //  i * !j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c01);
        return 1;
    }
    if ( c11 == c00 && c11 == c01 ) // !i *  j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c10);
        return 2;
    }
    if ( c11 == c01 && c11 == c10 ) // !i * !j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c00);
        return 3;
    }
    if ( c00 == c11 && c01 == c10 )
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c10);
        return 4;
    }
    return -1;
}